

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

uint toi(void *p,int n)

{
  byte bVar1;
  uint uVar2;
  int in_ESI;
  byte *in_RDI;
  uchar *v;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  if (in_ESI < 2) {
    if (in_ESI == 1) {
      local_4 = (uint)*in_RDI;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    bVar1 = *in_RDI;
    uVar2 = toi((void *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),(int)((ulong)in_RDI >> 0x20));
    local_4 = (uint)bVar1 + uVar2 * 0x100;
  }
  return local_4;
}

Assistant:

static unsigned int
toi(const void *p, int n)
{
	const unsigned char *v = (const unsigned char *)p;
	if (n > 1)
		return v[0] + 256 * toi(v + 1, n - 1);
	if (n == 1)
		return v[0];
	return (0);
}